

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaC_step(lua_State *L)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  global_State *pgVar4;
  global_State *g_00;
  global_State *pgVar5;
  ulong osize;
  TValue *pTVar6;
  long lVar7;
  Node *pNVar8;
  uint uVar9;
  Table *h;
  long lVar10;
  GCObject **ppGVar11;
  char *pcVar12;
  size_t sVar13;
  l_mem lVar14;
  GCObject *pGVar15;
  lu_mem lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  UpVal *pUVar21;
  global_State *g;
  
  pgVar4 = L->l_G;
  uVar2 = pgVar4->gcstepmul * 10;
  uVar19 = 0x7ffffffffffffffe;
  if (uVar2 != 0) {
    uVar19 = (ulong)uVar2;
  }
  pgVar4->gcdept = pgVar4->gcdept + (pgVar4->totalbytes - pgVar4->GCthreshold);
  do {
    g_00 = L->l_G;
    switch(g_00->gcstate) {
    case '\0':
      g_00->gray = (GCObject *)0x0;
      g_00->grayagain = (GCObject *)0x0;
      g_00->weak = (GCObject *)0x0;
      pGVar15 = (GCObject *)g_00->mainthread;
      if (((pGVar15->gch).marked & 3) != 0) {
        reallymarkobject(g_00,pGVar15);
        pGVar15 = (GCObject *)g_00->mainthread;
      }
      if ((3 < (pGVar15->th).l_gt.tt) &&
         (pGVar15 = (pGVar15->th).l_gt.value.gc, ((pGVar15->gch).marked & 3) != 0)) {
        reallymarkobject(g_00,pGVar15);
      }
      if ((3 < (L->l_G->l_registry).tt) &&
         (pGVar15 = (L->l_G->l_registry).value.gc, ((pGVar15->gch).marked & 3) != 0)) {
        reallymarkobject(g_00,pGVar15);
      }
      markmt(g_00);
      g_00->gcstate = '\x01';
    default:
switchD_00106c28_default:
      lVar10 = 0;
      break;
    case '\x01':
      if (g_00->gray == (GCObject *)0x0) {
        pUVar21 = (g_00->uvhead).u.l.next;
        if (pUVar21 != &g_00->uvhead) {
          do {
            if ((((pUVar21->marked & 7) == 0) && (3 < pUVar21->v->tt)) &&
               (pGVar15 = (pUVar21->v->value).gc, ((pGVar15->gch).marked & 3) != 0)) {
              reallymarkobject(g_00,pGVar15);
            }
            pUVar21 = (pUVar21->u).l.next;
          } while (pUVar21 != &g_00->uvhead);
          while (g_00->gray != (GCObject *)0x0) {
            propagatemark(g_00);
          }
        }
        g_00->gray = g_00->weak;
        g_00->weak = (GCObject *)0x0;
        if ((L->marked & 3) != 0) {
          reallymarkobject(g_00,(GCObject *)L);
        }
        markmt(g_00);
        while (g_00->gray != (GCObject *)0x0) {
          propagatemark(g_00);
        }
        pGVar15 = g_00->grayagain;
        g_00->gray = pGVar15;
        g_00->grayagain = (GCObject *)0x0;
        while (pGVar15 != (GCObject *)0x0) {
          propagatemark(g_00);
          pGVar15 = g_00->gray;
        }
        sVar13 = luaC_separateudata(L,0);
        pGVar15 = g_00->tmudata;
        if (pGVar15 != (GCObject *)0x0) {
          do {
            pGVar15 = (pGVar15->gch).next;
            (pGVar15->gch).marked = g_00->currentwhite & 3 | (pGVar15->gch).marked & 0xf8;
            reallymarkobject(g_00,pGVar15);
          } while (pGVar15 != g_00->tmudata);
        }
        if (g_00->gray == (GCObject *)0x0) {
          lVar10 = 0;
        }
        else {
          lVar10 = 0;
          do {
            lVar14 = propagatemark(g_00);
            lVar10 = lVar10 + lVar14;
          } while (g_00->gray != (GCObject *)0x0);
        }
        for (pGVar15 = g_00->weak; pGVar15 != (GCObject *)0x0; pGVar15 = (pGVar15->h).gclist) {
          if ((((pGVar15->gch).marked & 0x10) != 0) &&
             (lVar17 = (long)(pGVar15->h).sizearray, lVar17 != 0)) {
            lVar18 = lVar17 * 0x10 + -8;
            do {
              pTVar6 = (pGVar15->h).array;
              iVar20 = *(int *)((long)&pTVar6->value + lVar18);
              if (3 < iVar20) {
                lVar7 = *(long *)((long)pTVar6 + lVar18 + -8);
                bVar1 = *(byte *)(lVar7 + 9);
                if (iVar20 == 4) {
                  *(byte *)(lVar7 + 9) = bVar1 & 0xfc;
                }
                else if (((bVar1 & 3) != 0) || ((iVar20 == 7 && ((bVar1 & 8) != 0)))) {
                  *(undefined4 *)((long)&pTVar6->value + lVar18) = 0;
                }
              }
              lVar17 = lVar17 + -1;
              lVar18 = lVar18 + -0x10;
            } while (lVar17 != 0);
          }
          if ((pGVar15->h).lsizenode < 0x20) {
            lVar18 = (0x100000000 << ((pGVar15->h).lsizenode & 0x3f)) >> 0x20;
            lVar17 = lVar18 * 0x28 + -0x10;
            do {
              pNVar8 = (pGVar15->h).node;
              iVar20 = *(int *)((long)pNVar8 + lVar17 + -0x10);
              if (iVar20 != 0) {
                iVar3 = *(int *)((long)&(pNVar8->i_val).value + lVar17);
                if (iVar3 < 4) {
LAB_00106fc0:
                  if (3 < iVar20) {
                    lVar7 = *(long *)((long)pNVar8 + lVar17 + -0x18);
                    bVar1 = *(byte *)(lVar7 + 9);
                    if (iVar20 == 4) {
                      *(byte *)(lVar7 + 9) = bVar1 & 0xfc;
                    }
                    else if (((bVar1 & 3) != 0) || ((iVar20 == 7 && ((bVar1 & 8) != 0))))
                    goto LAB_00106fec;
                  }
                }
                else {
                  lVar7 = *(long *)((long)pNVar8 + lVar17 + -8);
                  bVar1 = *(byte *)(lVar7 + 9);
                  if (iVar3 == 4) {
                    *(byte *)(lVar7 + 9) = bVar1 & 0xfc;
                    iVar20 = *(int *)((long)pNVar8 + lVar17 + -0x10);
                    goto LAB_00106fc0;
                  }
                  if ((bVar1 & 3) == 0) goto LAB_00106fc0;
LAB_00106fec:
                  *(undefined4 *)((long)pNVar8 + lVar17 + -0x10) = 0;
                  if (3 < *(int *)((long)&(pNVar8->i_val).value + lVar17)) {
                    *(undefined4 *)((long)&(pNVar8->i_val).value + lVar17) = 0xb;
                  }
                }
              }
              lVar18 = lVar18 + -1;
              lVar17 = lVar17 + -0x28;
            } while (lVar18 != 0);
          }
        }
        g_00->currentwhite = g_00->currentwhite ^ 3;
        g_00->sweepstrgc = 0;
        g_00->sweepgc = &g_00->rootgc;
        g_00->gcstate = '\x02';
        g_00->estimate = g_00->totalbytes - (lVar10 + sVar13);
        lVar10 = 0;
      }
      else {
        lVar10 = propagatemark(g_00);
      }
      break;
    case '\x02':
      lVar16 = g_00->totalbytes;
      iVar20 = g_00->sweepstrgc;
      g_00->sweepstrgc = iVar20 + 1;
      sweeplist(L,(g_00->strt).hash + iVar20,0xfffffffffffffffd);
      if ((g_00->strt).size <= g_00->sweepstrgc) {
        g_00->gcstate = '\x03';
      }
      g_00->estimate = g_00->estimate + (g_00->totalbytes - lVar16);
      lVar10 = 10;
      break;
    case '\x03':
      lVar16 = g_00->totalbytes;
      ppGVar11 = sweeplist(L,g_00->sweepgc,0x28);
      g_00->sweepgc = ppGVar11;
      if (*ppGVar11 == (GCObject *)0x0) {
        pgVar5 = L->l_G;
        uVar2 = (pgVar5->strt).size;
        uVar9 = uVar2 + 3;
        if (-1 < (int)uVar2) {
          uVar9 = uVar2;
        }
        if ((0x40 < (int)uVar2) && ((pgVar5->strt).nuse < (uint)((int)uVar9 >> 2))) {
          luaS_resize(L,uVar2 >> 1);
        }
        osize = (pgVar5->buff).buffsize;
        if (0x40 < osize) {
          pcVar12 = (char *)luaM_realloc_(L,(pgVar5->buff).buffer,osize,osize >> 1);
          (pgVar5->buff).buffer = pcVar12;
          (pgVar5->buff).buffsize = osize >> 1;
        }
        g_00->gcstate = '\x04';
      }
      g_00->estimate = g_00->estimate + (g_00->totalbytes - lVar16);
      lVar10 = 400;
      break;
    case '\x04':
      if (g_00->tmudata == (GCObject *)0x0) {
        g_00->gcstate = '\0';
        g_00->gcdept = 0;
        goto switchD_00106c28_default;
      }
      GCTM(L);
      lVar10 = 100;
      if (100 < g_00->estimate) {
        g_00->estimate = g_00->estimate - 100;
      }
    }
    if ((pgVar4->gcstate == '\0') || (uVar19 = uVar19 - lVar10, (long)uVar19 < 1)) {
      if (pgVar4->gcstate == '\0') {
        lVar16 = (long)pgVar4->gcpause * (pgVar4->estimate / 100);
      }
      else if (pgVar4->gcdept < 0x400) {
        lVar16 = pgVar4->totalbytes + 0x400;
      }
      else {
        pgVar4->gcdept = pgVar4->gcdept - 0x400;
        lVar16 = pgVar4->totalbytes;
      }
      pgVar4->GCthreshold = lVar16;
      return;
    }
  } while( true );
}

Assistant:

static void luaC_step(lua_State*L){
global_State*g=G(L);
l_mem lim=(1024u/100)*g->gcstepmul;
if(lim==0)
lim=(((lu_mem)(~(lu_mem)0)-2)-1)/2;
g->gcdept+=g->totalbytes-g->GCthreshold;
do{
lim-=singlestep(L);
if(g->gcstate==0)
break;
}while(lim>0);
if(g->gcstate!=0){
if(g->gcdept<1024u)
g->GCthreshold=g->totalbytes+1024u;
else{
g->gcdept-=1024u;
g->GCthreshold=g->totalbytes;
}
}
else{
setthreshold(g);
}
}